

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O0

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
Chi2Test_abi_cxx11_(Float *frequencies,Float *expFrequencies,int thetaRes,int phiRes,int sampleCount
                   ,Float minExpFrequency,Float significanceLevel,int numTests)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  vector<Cell,_std::allocator<Cell>_> *pvVar2;
  reference pvVar3;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  int in_R8D;
  int in_R9D;
  float in_XMM0_Da;
  float fVar4;
  bool *__x;
  double dVar5;
  float in_XMM1_Da;
  undefined1 auVar6 [16];
  int in_stack_00000008;
  string result_2;
  Float alpha;
  Float pval;
  string result_1;
  Float diff_1;
  Float diff;
  string result;
  Cell *c;
  iterator __end1;
  iterator __begin1;
  vector<Cell,_std::allocator<Cell>_> *__range1;
  int dof;
  int pooledCells;
  Float chsq;
  Float pooledExpFrequencies;
  Float pooledFrequencies;
  size_t i;
  vector<Cell,_std::allocator<Cell>_> cells;
  vector<Cell,_std::allocator<Cell>_> *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  bool *in_stack_fffffffffffffe58;
  allocator_type *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  Float in_stack_fffffffffffffe6c;
  vector<Cell,_std::allocator<Cell>_> *in_stack_fffffffffffffe70;
  vector<Cell,_std::allocator<Cell>_> *fmt;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *__s;
  allocator<char> local_159;
  string local_158 [38];
  undefined1 local_132;
  undefined1 local_131;
  string local_130 [36];
  float local_10c;
  float local_108;
  undefined1 local_101;
  string local_100 [32];
  float local_e0;
  float local_dc;
  undefined4 local_d8;
  undefined1 local_d1;
  string local_d0 [32];
  reference local_b0;
  Cell *local_a8;
  __normal_iterator<Cell_*,_std::vector<Cell,_std::allocator<Cell>_>_> local_a0;
  vector<Cell,_std::allocator<Cell>_> *local_98;
  int local_90;
  int local_8c;
  float local_88;
  float local_84;
  float local_80;
  Cell *local_78;
  Cell *local_70;
  vector<Cell,_std::allocator<Cell>_> *local_68;
  vector<Cell,_std::allocator<Cell>_> local_48;
  float local_2c;
  float local_28;
  int local_24;
  long local_18;
  long local_10;
  
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (long)(in_ECX * in_R8D);
  __s = in_RDI;
  local_2c = in_XMM1_Da;
  local_28 = in_XMM0_Da;
  local_24 = in_R9D;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<Cell>::allocator((allocator<Cell> *)0x4f58b6);
  std::vector<Cell,_std::allocator<Cell>_>::vector
            (in_stack_fffffffffffffe70,CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)
             ,in_stack_fffffffffffffe60);
  std::allocator<Cell>::~allocator((allocator<Cell> *)0x4f58dc);
  local_68 = (vector<Cell,_std::allocator<Cell>_> *)0x0;
  while (fmt = local_68,
        pvVar2 = (vector<Cell,_std::allocator<Cell>_> *)
                 std::vector<Cell,_std::allocator<Cell>_>::size(&local_48), fmt < pvVar2) {
    in_stack_fffffffffffffe6c = *(Float *)(local_18 + (long)local_68 * 4);
    pvVar3 = std::vector<Cell,_std::allocator<Cell>_>::operator[](&local_48,(size_type)local_68);
    pvVar3->expFrequency = in_stack_fffffffffffffe6c;
    in_stack_fffffffffffffe70 = local_68;
    pvVar3 = std::vector<Cell,_std::allocator<Cell>_>::operator[](&local_48,(size_type)local_68);
    pvVar3->index = (size_t)in_stack_fffffffffffffe70;
    local_68 = (vector<Cell,_std::allocator<Cell>_> *)
               ((long)&(local_68->super__Vector_base<Cell,_std::allocator<Cell>_>)._M_impl.
                       super__Vector_impl_data._M_start + 1);
  }
  pvVar2 = &local_48;
  local_70 = (Cell *)std::vector<Cell,_std::allocator<Cell>_>::begin(in_stack_fffffffffffffe48);
  local_78 = (Cell *)std::vector<Cell,_std::allocator<Cell>_>::end(in_stack_fffffffffffffe48);
  std::
  sort<__gnu_cxx::__normal_iterator<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::Cell*,std::vector<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::Cell,std::allocator<Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::Cell>>>,Chi2Test[abi:cxx11](float_const*,float_const*,int,int,int,float,float,int)::__0>
            (local_70,local_78);
  local_80 = 0.0;
  local_84 = 0.0;
  local_88 = 0.0;
  local_8c = 0;
  local_90 = 0;
  local_98 = &local_48;
  local_a0._M_current =
       (Cell *)std::vector<Cell,_std::allocator<Cell>_>::begin(in_stack_fffffffffffffe48);
  local_a8 = (Cell *)std::vector<Cell,_std::allocator<Cell>_>::end(in_stack_fffffffffffffe48);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<Cell_*,_std::vector<Cell,_std::allocator<Cell>_>_> *)
                            CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                            (__normal_iterator<Cell_*,_std::vector<Cell,_std::allocator<Cell>_>_> *)
                            in_stack_fffffffffffffe48), bVar1) {
    local_b0 = __gnu_cxx::__normal_iterator<Cell_*,_std::vector<Cell,_std::allocator<Cell>_>_>::
               operator*(&local_a0);
    fVar4 = *(float *)(local_18 + local_b0->index * 4);
    if ((fVar4 != 0.0) || (NAN(fVar4))) {
      if (local_28 <= *(float *)(local_18 + local_b0->index * 4)) {
        if ((local_84 <= 0.0) || (local_28 <= local_84)) {
          local_dc = *(float *)(local_10 + local_b0->index * 4) -
                     *(float *)(local_18 + local_b0->index * 4);
          local_88 = (local_dc * local_dc) / *(float *)(local_18 + local_b0->index * 4) + local_88;
          local_90 = local_90 + 1;
        }
        else {
          local_80 = *(float *)(local_10 + local_b0->index * 4) + local_80;
          local_84 = *(float *)(local_18 + local_b0->index * 4) + local_84;
          local_8c = local_8c + 1;
        }
      }
      else {
        local_80 = *(float *)(local_10 + local_b0->index * 4) + local_80;
        local_84 = *(float *)(local_18 + local_b0->index * 4) + local_84;
        local_8c = local_8c + 1;
      }
    }
    else if ((float)local_24 * 1e-05 < *(float *)(local_10 + local_b0->index * 4)) {
      pbrt::StringPrintf<float_const&>((char *)fmt,(float *)in_stack_fffffffffffffe70);
      local_d1 = 0;
      std::make_pair<bool,std::__cxx11::string&>
                (in_stack_fffffffffffffe58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      local_d8 = 1;
      std::__cxx11::string::~string(local_d0);
      goto LAB_004f609f;
    }
    __gnu_cxx::__normal_iterator<Cell_*,_std::vector<Cell,_std::allocator<Cell>_>_>::operator++
              (&local_a0);
  }
  if ((0.0 < local_84) || (0.0 < local_80)) {
    local_e0 = local_80 - local_84;
    local_88 = (local_e0 * local_e0) / local_84 + local_88;
    local_90 = local_90 + 1;
  }
  local_90 = local_90 + -1;
  if (local_90 < 1) {
    pbrt::StringPrintf<int&>((char *)fmt,(int *)in_stack_fffffffffffffe70);
    local_101 = 0;
    std::make_pair<bool,std::__cxx11::string&>
              (in_stack_fffffffffffffe58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    local_d8 = 1;
    std::__cxx11::string::~string(local_100);
  }
  else {
    __x = (bool *)Chi2CDF((double)in_stack_fffffffffffffe48,0);
    local_108 = 1.0 - (float)(double)__x;
    auVar6._0_4_ = 1.0 / (float)in_stack_00000008;
    auVar6._4_12_ = SUB6012((undefined1  [60])0x0,0);
    dVar5 = std::pow((double)(ulong)(uint)(1.0 - local_2c),auVar6._0_8_);
    fVar4 = SUB84(dVar5,0);
    local_10c = 1.0 - fVar4;
    if (local_10c <= local_108) {
      bVar1 = std::isfinite(local_108);
      in_stack_fffffffffffffe50 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe50);
      if (bVar1) {
        local_132 = 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this,&__s->first,(allocator<char> *)in_RDI);
        std::make_pair<bool,std::__cxx11::string>
                  (__x,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(fVar4,in_stack_fffffffffffffe50));
        std::__cxx11::string::~string(local_158);
        std::allocator<char>::~allocator(&local_159);
        local_d8 = 1;
        goto LAB_004f609f;
      }
    }
    pbrt::StringPrintf<float&,float&>
              ((char *)fmt,(float *)in_stack_fffffffffffffe70,
               (float *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    local_131 = 0;
    std::make_pair<bool,std::__cxx11::string&>
              (__x,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(fVar4,in_stack_fffffffffffffe50));
    local_d8 = 1;
    std::__cxx11::string::~string(local_130);
  }
LAB_004f609f:
  std::vector<Cell,_std::allocator<Cell>_>::~vector(pvVar2);
  return __s;
}

Assistant:

std::pair<bool, std::string> Chi2Test(const Float* frequencies,
                                      const Float* expFrequencies, int thetaRes,
                                      int phiRes, int sampleCount, Float minExpFrequency,
                                      Float significanceLevel, int numTests) {
    struct Cell {
        Float expFrequency;
        size_t index;
    };

    /* Sort all cells by their expected frequencies */
    std::vector<Cell> cells(thetaRes * phiRes);
    for (size_t i = 0; i < cells.size(); ++i) {
        cells[i].expFrequency = expFrequencies[i];
        cells[i].index = i;
    }
    std::sort(cells.begin(), cells.end(), [](const Cell& a, const Cell& b) {
        return a.expFrequency < b.expFrequency;
    });

    /* Compute the Chi^2 statistic and pool cells as necessary */
    Float pooledFrequencies = 0, pooledExpFrequencies = 0, chsq = 0;
    int pooledCells = 0, dof = 0;

    for (const Cell& c : cells) {
        if (expFrequencies[c.index] == 0) {
            if (frequencies[c.index] > sampleCount * 1e-5f) {
                /* Uh oh: samples in a c that should be completely empty
                   according to the probability density function. Ordinarily,
                   even a single sample requires immediate rejection of the null
                   hypothesis. But due to finite-precision computations and
                   rounding
                   errors, this can occasionally happen without there being an
                   actual bug. Therefore, the criterion here is a bit more
                   lenient. */

                std::string result =
                    StringPrintf("Encountered %f samples in a c with expected "
                                 "frequency 0. Rejecting the null hypothesis!",
                                 frequencies[c.index]);
                return std::make_pair(false, result);
            }
        } else if (expFrequencies[c.index] < minExpFrequency) {
            /* Pool cells with low expected frequencies */
            pooledFrequencies += frequencies[c.index];
            pooledExpFrequencies += expFrequencies[c.index];
            pooledCells++;
        } else if (pooledExpFrequencies > 0 && pooledExpFrequencies < minExpFrequency) {
            /* Keep on pooling cells until a sufficiently high
               expected frequency is achieved. */
            pooledFrequencies += frequencies[c.index];
            pooledExpFrequencies += expFrequencies[c.index];
            pooledCells++;
        } else {
            Float diff = frequencies[c.index] - expFrequencies[c.index];
            chsq += (diff * diff) / expFrequencies[c.index];
            ++dof;
        }
    }

    if (pooledExpFrequencies > 0 || pooledFrequencies > 0) {
        Float diff = pooledFrequencies - pooledExpFrequencies;
        chsq += (diff * diff) / pooledExpFrequencies;
        ++dof;
    }

    /* All parameters are assumed to be known, so there is no
       additional DF reduction due to model parameters */
    dof -= 1;

    if (dof <= 0) {
        std::string result =
            StringPrintf("The number of degrees of freedom %d is too low!", dof);
        return std::make_pair(false, result);
    }

    /* Probability of obtaining a test statistic at least
       as extreme as the one observed under the assumption
       that the distributions match */
    Float pval = 1 - (Float)Chi2CDF(chsq, dof);

    /* Apply the Sidak correction term, since we'll be conducting multiple
       independent
       hypothesis tests. This accounts for the fact that the probability of a
       failure
       increases quickly when several hypothesis tests are run in sequence. */
    Float alpha = 1.0f - std::pow(1.0f - significanceLevel, 1.0f / numTests);

    if (pval < alpha || !std::isfinite(pval)) {
        std::string result = StringPrintf("Rejected the null hypothesis (p-value = %f, "
                                          "significance level = %f",
                                          pval, alpha);
        return std::make_pair(false, result);
    } else {
        return std::make_pair(true, std::string(""));
    }
}